

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib526.c
# Opt level: O3

int test(char *URL)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  int *piVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  char *pcVar8;
  int iVar9;
  long lVar10;
  timeval tVar11;
  int running;
  CURL *curl [4];
  fd_set exc;
  fd_set wr;
  fd_set rd;
  int local_1f0;
  int local_1ec;
  timeval local_1e8;
  long local_1d8 [4];
  fd_set local_1b8;
  fd_set local_138;
  fd_set local_b8;
  
  local_1d8[0] = 0;
  local_1d8[1] = 0;
  local_1d8[2] = 0;
  local_1d8[3] = 0;
  tv_test_start = tutil_tvnow();
  iVar1 = curl_global_init(3);
  uVar7 = _stderr;
  if (iVar1 == 0) {
    lVar10 = 0;
    do {
      lVar3 = curl_easy_init();
      local_1d8[lVar10] = lVar3;
      if (lVar3 == 0) {
        lVar10 = 0;
        curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib526.c"
                      ,0x47);
        iVar1 = 0x7c;
        goto LAB_0010243b;
      }
      iVar1 = curl_easy_setopt(lVar3,0x2712,URL);
      uVar7 = _stderr;
      if (iVar1 != 0) {
        uVar2 = curl_easy_strerror(iVar1);
        pcVar8 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        lVar10 = 0;
        uVar6 = 0x49;
        goto LAB_0010242e;
      }
      iVar1 = curl_easy_setopt(lVar3,0x29,1);
      uVar7 = _stderr;
      if (iVar1 != 0) {
        uVar2 = curl_easy_strerror(iVar1);
        pcVar8 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        lVar10 = 0;
        uVar6 = 0x4b;
        goto LAB_0010242e;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 4);
    lVar10 = curl_multi_init();
    lVar3 = local_1d8[0];
    if (lVar10 == 0) {
      lVar10 = 0;
      curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib526.c"
                    ,0x4e);
      iVar1 = 0x7b;
    }
    else {
      iVar1 = curl_multi_add_handle(lVar10,local_1d8[0]);
      uVar7 = _stderr;
      if (iVar1 == 0) {
        curl_mfprintf(_stderr,"Start at URL 0\n");
        local_1f0 = -99;
        local_1e8.tv_sec = 1;
        local_1e8.tv_usec = 0;
        iVar1 = curl_multi_perform(lVar10,&local_1ec);
        if (iVar1 == 0) {
          iVar9 = 0;
          do {
            if (local_1ec < 0) {
              pcVar8 = 
              "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
              ;
              uVar7 = 0x5c;
LAB_001027d5:
              curl_mfprintf(_stderr,pcVar8,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib526.c"
                            ,uVar7);
              iVar1 = 0x7a;
              goto LAB_0010243b;
            }
            tVar11 = tutil_tvnow();
            lVar4 = tutil_tvdiff(tVar11,tv_test_start);
            if (60000 < lVar4) {
              uVar7 = 0x5e;
LAB_00102848:
              curl_mfprintf(_stderr,
                            "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib526.c"
                            ,uVar7);
              iVar1 = 0x7d;
              goto LAB_0010243b;
            }
            if (local_1ec == 0) {
              if (2 < iVar9) {
                iVar1 = 0;
                goto LAB_0010243b;
              }
              iVar9 = iVar9 + 1;
              curl_mfprintf(_stderr,"Advancing to URL %d\n",iVar9);
              curl_multi_remove_handle(lVar10,lVar3);
              curl_easy_reset(lVar3);
              iVar1 = curl_easy_setopt(lVar3,0x2712,URL);
              uVar7 = _stderr;
              if (iVar1 != 0) {
                uVar2 = curl_easy_strerror(iVar1);
                pcVar8 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                uVar6 = 0x71;
                goto LAB_0010242e;
              }
              iVar1 = curl_easy_setopt(lVar3,0x29,1);
              uVar7 = _stderr;
              if (iVar1 != 0) {
                uVar2 = curl_easy_strerror(iVar1);
                pcVar8 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                uVar6 = 0x73;
                goto LAB_0010242e;
              }
              iVar1 = curl_multi_add_handle(lVar10,lVar3);
              uVar7 = _stderr;
              if (iVar1 != 0) {
                uVar2 = curl_multi_strerror(iVar1);
                pcVar8 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
                uVar6 = 0x76;
                goto LAB_0010242e;
              }
            }
            local_b8.__fds_bits[0xe] = 0;
            local_b8.__fds_bits[0xf] = 0;
            local_b8.__fds_bits[0xc] = 0;
            local_b8.__fds_bits[0xd] = 0;
            local_b8.__fds_bits[10] = 0;
            local_b8.__fds_bits[0xb] = 0;
            local_b8.__fds_bits[8] = 0;
            local_b8.__fds_bits[9] = 0;
            local_b8.__fds_bits[6] = 0;
            local_b8.__fds_bits[7] = 0;
            local_b8.__fds_bits[4] = 0;
            local_b8.__fds_bits[5] = 0;
            local_b8.__fds_bits[2] = 0;
            local_b8.__fds_bits[3] = 0;
            local_b8.__fds_bits[0] = 0;
            local_b8.__fds_bits[1] = 0;
            local_138.__fds_bits[0] = 0;
            local_138.__fds_bits[1] = 0;
            local_138.__fds_bits[2] = 0;
            local_138.__fds_bits[3] = 0;
            local_138.__fds_bits[4] = 0;
            local_138.__fds_bits[5] = 0;
            local_138.__fds_bits[6] = 0;
            local_138.__fds_bits[7] = 0;
            local_138.__fds_bits[8] = 0;
            local_138.__fds_bits[9] = 0;
            local_138.__fds_bits[10] = 0;
            local_138.__fds_bits[0xb] = 0;
            local_138.__fds_bits[0xc] = 0;
            local_138.__fds_bits[0xd] = 0;
            local_138.__fds_bits[0xe] = 0;
            local_138.__fds_bits[0xf] = 0;
            local_1b8.__fds_bits[0] = 0;
            local_1b8.__fds_bits[1] = 0;
            local_1b8.__fds_bits[2] = 0;
            local_1b8.__fds_bits[3] = 0;
            local_1b8.__fds_bits[4] = 0;
            local_1b8.__fds_bits[5] = 0;
            local_1b8.__fds_bits[6] = 0;
            local_1b8.__fds_bits[7] = 0;
            local_1b8.__fds_bits[8] = 0;
            local_1b8.__fds_bits[9] = 0;
            local_1b8.__fds_bits[10] = 0;
            local_1b8.__fds_bits[0xb] = 0;
            local_1b8.__fds_bits[0xc] = 0;
            local_1b8.__fds_bits[0xd] = 0;
            local_1b8.__fds_bits[0xe] = 0;
            local_1b8.__fds_bits[0xf] = 0;
            iVar1 = curl_multi_fdset(lVar10,&local_b8,&local_138,&local_1b8,&local_1f0);
            uVar7 = _stderr;
            if (iVar1 != 0) {
              uVar2 = curl_multi_strerror(iVar1);
              pcVar8 = "%s:%d curl_multi_fdset() failed, with code %d (%s)\n";
              uVar6 = 0x84;
              goto LAB_0010242e;
            }
            if (local_1f0 < -1) {
              pcVar8 = 
              "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n";
              uVar7 = 0x84;
              goto LAB_001027d5;
            }
            iVar1 = select_wrapper(local_1f0 + 1,&local_b8,&local_138,&local_1b8,&local_1e8);
            if (iVar1 == -1) {
              piVar5 = __errno_location();
              uVar7 = _stderr;
              iVar1 = *piVar5;
              pcVar8 = strerror(iVar1);
              curl_mfprintf(uVar7,"%s:%d select() failed, with errno %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib526.c"
                            ,0x88,iVar1,pcVar8);
              iVar1 = 0x79;
              goto LAB_0010243b;
            }
            tVar11 = tutil_tvnow();
            lVar4 = tutil_tvdiff(tVar11,tv_test_start);
            if (60000 < lVar4) {
              uVar7 = 0x8a;
              goto LAB_00102848;
            }
            local_1f0 = -99;
            local_1e8.tv_sec = 1;
            local_1e8.tv_usec = 0;
            iVar1 = curl_multi_perform(lVar10,&local_1ec);
          } while (iVar1 == 0);
        }
        uVar7 = _stderr;
        uVar2 = curl_multi_strerror(iVar1);
        pcVar8 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
        uVar6 = 0x5c;
      }
      else {
        uVar2 = curl_multi_strerror(iVar1);
        pcVar8 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
        uVar6 = 0x50;
      }
LAB_0010242e:
      curl_mfprintf(uVar7,pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib526.c"
                    ,uVar6,iVar1,uVar2);
    }
LAB_0010243b:
    lVar3 = 0;
    do {
      curl_easy_cleanup(local_1d8[lVar3]);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    curl_multi_cleanup(lVar10);
    curl_global_cleanup();
  }
  else {
    uVar2 = curl_easy_strerror(iVar1);
    curl_mfprintf(uVar7,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib526.c"
                  ,0x43,iVar1,uVar2);
  }
  return iVar1;
}

Assistant:

int test(char *URL)
{
  int res = 0;
  CURL *curl[NUM_HANDLES];
  int running;
  CURLM *m = NULL;
  int current = 0;
  int i;

  for(i=0; i < NUM_HANDLES; i++)
    curl[i] = NULL;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  /* get NUM_HANDLES easy handles */
  for(i=0; i < NUM_HANDLES; i++) {
    easy_init(curl[i]);
    /* specify target */
    easy_setopt(curl[i], CURLOPT_URL, URL);
    /* go verbose */
    easy_setopt(curl[i], CURLOPT_VERBOSE, 1L);
  }

  multi_init(m);

  multi_add_handle(m, curl[current]);

  fprintf(stderr, "Start at URL 0\n");

  for(;;) {
    struct timeval interval;
    fd_set rd, wr, exc;
    int maxfd = -99;

    interval.tv_sec = 1;
    interval.tv_usec = 0;

    multi_perform(m, &running);

    abort_on_test_timeout();

    if(!running) {
#ifdef LIB527
      /* NOTE: this code does not remove the handle from the multi handle
         here, which would be the nice, sane and documented way of working.
         This however tests that the API survives this abuse gracefully. */
      curl_easy_cleanup(curl[current]);
      curl[current] = NULL;
#endif
      if(++current < NUM_HANDLES) {
        fprintf(stderr, "Advancing to URL %d\n", current);
#ifdef LIB532
        /* first remove the only handle we use */
        curl_multi_remove_handle(m, curl[0]);

        /* make us re-use the same handle all the time, and try resetting
           the handle first too */
        curl_easy_reset(curl[0]);
        easy_setopt(curl[0], CURLOPT_URL, URL);
        /* go verbose */
        easy_setopt(curl[0], CURLOPT_VERBOSE, 1L);

        /* re-add it */
        multi_add_handle(m, curl[0]);
#else
        multi_add_handle(m, curl[current]);
#endif
      }
      else {
        break; /* done */
      }
    }

    FD_ZERO(&rd);
    FD_ZERO(&wr);
    FD_ZERO(&exc);

    multi_fdset(m, &rd, &wr, &exc, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd+1, &rd, &wr, &exc, &interval);

    abort_on_test_timeout();
  }

test_cleanup:

#if defined(LIB526)

  /* test 526 and 528 */
  /* proper cleanup sequence - type PB */

  for(i=0; i < NUM_HANDLES; i++) {
    curl_multi_remove_handle(m, curl[i]);
    curl_easy_cleanup(curl[i]);
  }
  curl_multi_cleanup(m);
  curl_global_cleanup();

#elif defined(LIB527)

  /* test 527 */

  /* Upon non-failure test flow the easy's have already been cleanup'ed. In
     case there is a failure we arrive here with easy's that have not been
     cleanup'ed yet, in this case we have to cleanup them or otherwise these
     will be leaked, let's use undocumented cleanup sequence - type UB */

  if(res)
    for(i=0; i < NUM_HANDLES; i++)
      curl_easy_cleanup(curl[i]);

  curl_multi_cleanup(m);
  curl_global_cleanup();

#elif defined(LIB532)

  /* test 532 */
  /* undocumented cleanup sequence - type UB */

  for(i=0; i < NUM_HANDLES; i++)
    curl_easy_cleanup(curl[i]);
  curl_multi_cleanup(m);
  curl_global_cleanup();

#endif

  return res;
}